

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMove4<(moira::Instr)71,(moira::Mode)10,(moira::Size)4>(Moira *this,u16 opcode)

{
  int *piVar1;
  ushort uVar2;
  u16 uVar3;
  u32 uVar4;
  u32 uVar5;
  undefined8 in_RAX;
  uint n;
  AEStackFrame frame;
  bool error;
  bool local_31;
  
  local_31 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar2 = (this->queue).ird;
  uVar4 = computeEA<(moira::Mode)10,(moira::Size)4,0ul>(this,opcode & 7);
  uVar4 = readM<(moira::MemSpace)2,(moira::Size)4,128ul>(this,uVar4,&local_31);
  if (local_31 == false) {
    n = opcode >> 9 & 7;
    (this->reg).sr.n = SUB41(uVar4 >> 0x1f,0);
    (this->reg).sr.z = uVar4 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar5 = (this->reg).pc;
    (this->reg).pc0 = uVar5;
    (this->queue).ird = (this->queue).irc;
    uVar5 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar5 + 2);
    (this->queue).irc = (u16)uVar5;
    (*this->_vptr_Moira[0x19])(this,0xfffffffe);
    uVar5 = computeEA<(moira::Mode)4,(moira::Size)4,0ul>(this,n);
    if ((uVar5 & 1) == 0) {
      writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,uVar5 + 2,uVar4 & 0xffff);
      writeM<(moira::MemSpace)1,(moira::Size)2,5ul>(this,uVar5,uVar4 >> 0x10);
      piVar1 = (int *)((long)this->exec + (ulong)n * 4 + -0x38);
      *piVar1 = *piVar1 + -4;
    }
    else {
      uVar4 = (this->reg).pc;
      uVar3 = getSR(this,&(this->reg).sr);
      this->fcl = '\x01';
      frame._0_8_ = ((ulong)(uVar5 + 2) << 0x20) +
                    (ulong)(uVar2 & 0xffffffe0) + (ulong)(this->reg).sr.s * 4 + 1;
      frame.pc = uVar4 + 2;
      frame.sr = uVar3;
      frame.ird = uVar2;
      execAddressError(this,frame,0);
    }
  }
  return;
}

Assistant:

void
Moira::execMove4(u16 opcode)
{
    u16 ird = getIRD();
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    /* Source: http://pasti.fxatari.com/68kdocs/68kPrefetch.html
     *
     * "When the destination addressing mode is pre-decrement, steps 4 and 5
     *  above are inverted. So it behaves like a read modify instruction and it
     *  is a class 0 instruction. Note: The behavior is the same disregarding
     *  transfer size (byte, word or long), and disregarding the source
     *  addressing mode."
     */
    if (!readOp <M,S,STD_AE_FRAME> (src, ea, data)) return;

    // Determine next address error stack frame format
    const u64 flags0 = AE_WRITE | AE_DATA;
    const u64 flags1 = AE_WRITE | AE_DATA | AE_SET_CB3;
    const u64 flags2 = AE_WRITE | AE_DATA;
    int format = (S == Long) ? 0 : reg.sr.c ? 1 : 2;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch();
    sync(-2);

    ea = computeEA<MODE_PD, S>(dst);
    
    // Check for address error
    if (misaligned<S>(ea)) {
        if (format == 0) execAddressError(makeFrame<flags0>(ea + 2, reg.pc + 2, getSR(), ird));
        if (format == 1) execAddressError(makeFrame<flags1>(ea, reg.pc + 2), 2);
        if (format == 2) execAddressError(makeFrame<flags2>(ea, reg.pc + 2), 2);
        if (S != Long) updateAn <MODE_PD, S> (dst);
        return;
    }
    
    writeM<MODE_PD, S, REVERSE | POLLIPL>(ea, data);
    updateAn<MODE_PD, S>(dst);
}